

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O3

vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
* __thiscall
PDA::getStateCombinations
          (vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
           *__return_storage_ptr__,PDA *this,int size)

{
  pointer ppSVar1;
  State *pSVar2;
  vector<State_*,_std::allocator<State_*>_> *__x;
  pointer ppSVar3;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  *pvVar4;
  initializer_list<State_*> __l;
  initializer_list<State_*> __l_00;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  smallerCombinations;
  vector<State_*,_std::allocator<State_*>_> combination;
  allocator_type local_d1;
  pointer local_d0;
  vector<State_*,_std::allocator<State_*>_> local_c8;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  *local_b0;
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  local_a8;
  vector<State_*,_std::allocator<State_*>_> local_88;
  pointer local_70;
  State *local_68;
  vector<State_*,_std::allocator<State_*>_> local_60;
  vector<State_*,_std::allocator<State_*>_> local_48;
  
  local_a8.
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (size == 1) {
    ppSVar3 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar1 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_b0 = __return_storage_ptr__;
    if (ppSVar3 != ppSVar1) {
      do {
        local_88.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*ppSVar3;
        __l._M_len = 1;
        __l._M_array = (iterator)&local_88;
        std::vector<State_*,_std::allocator<State_*>_>::vector
                  (&local_c8,__l,(allocator_type *)&local_60);
        std::
        vector<std::vector<State*,std::allocator<State*>>,std::allocator<std::vector<State*,std::allocator<State*>>>>
        ::emplace_back<std::vector<State*,std::allocator<State*>>>
                  ((vector<std::vector<State*,std::allocator<State*>>,std::allocator<std::vector<State*,std::allocator<State*>>>>
                    *)&local_a8,&local_c8);
        if ((vector<State_*,_std::allocator<State_*>_> *)
            local_c8.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
            super__Vector_impl_data._M_start != (vector<State_*,_std::allocator<State_*>_> *)0x0) {
          operator_delete(local_c8.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c8.super__Vector_base<State_*,_std::allocator<State_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.super__Vector_base<State_*,_std::allocator<State_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        ppSVar3 = ppSVar3 + 1;
      } while (ppSVar3 != ppSVar1);
    }
  }
  else {
    pvVar4 = __return_storage_ptr__;
    if (size < 1) goto LAB_00109d6f;
    local_b0 = __return_storage_ptr__;
    getStateCombinations
              ((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
                *)&local_c8,this,size + -1);
    local_d0 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_70 = (this->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_d0 != local_70) {
      do {
        ppSVar3 = local_c8.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (local_c8.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_c8.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pSVar2 = *local_d0;
          __x = (vector<State_*,_std::allocator<State_*>_> *)
                local_c8.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                super__Vector_impl_data._M_start;
          do {
            std::vector<State_*,_std::allocator<State_*>_>::vector(&local_88,__x);
            __l_00._M_len = 1;
            __l_00._M_array = &local_68;
            local_68 = pSVar2;
            std::vector<State_*,_std::allocator<State_*>_>::vector(&local_48,__l_00,&local_d1);
            vectorUnion(&local_60,&local_48,&local_88);
            std::
            vector<std::vector<State*,std::allocator<State*>>,std::allocator<std::vector<State*,std::allocator<State*>>>>
            ::emplace_back<std::vector<State*,std::allocator<State*>>>
                      ((vector<std::vector<State*,std::allocator<State*>>,std::allocator<std::vector<State*,std::allocator<State*>>>>
                        *)&local_a8,&local_60);
            if (local_60.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)local_60.super__Vector_base<State_*,_std::allocator<State_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_60.super__Vector_base<State_*,_std::allocator<State_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_48.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_48.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)local_48.super__Vector_base<State_*,_std::allocator<State_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.super__Vector_base<State_*,_std::allocator<State_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if ((State *)local_88.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                         super__Vector_impl_data._M_start != (State *)0x0) {
              operator_delete(local_88.super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl
                              .super__Vector_impl_data._M_start,
                              (long)local_88.super__Vector_base<State_*,_std::allocator<State_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_88.super__Vector_base<State_*,_std::allocator<State_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            __x = __x + 1;
          } while (__x != (vector<State_*,_std::allocator<State_*>_> *)ppSVar3);
        }
        local_d0 = local_d0 + 1;
      } while (local_d0 != local_70);
    }
    std::
    vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
    ::~vector((vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
               *)&local_c8);
  }
  __return_storage_ptr__ = &local_a8;
  (local_b0->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_a8.
       super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_b0->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_a8.
       super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_b0->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_a8.
       super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar4 = local_b0;
LAB_00109d6f:
  (__return_storage_ptr__->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<State_*,_std::allocator<State_*>_>,_std::allocator<std::vector<State_*,_std::allocator<State_*>_>_>_>
  ::~vector(&local_a8);
  return pvVar4;
}

Assistant:

std::vector<std::vector<State *>> PDA::getStateCombinations(int size) {
    std::vector<std::vector<State*>> combinations = {};
    if(size == 1) {
        for(State* state: statesQ){
            combinations.push_back({state});
        }
    } else if (size < 1) {
        return {};
    } else {
        std::vector<std::vector<State*>> smallerCombinations = getStateCombinations(size-1);
        for (State* state: statesQ) {
            for(std::vector<State*> combination: smallerCombinations){
                combinations.push_back(vectorUnion({state}, combination));
            }
        }
    }

    return combinations;
}